

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatasrc.c
# Opt level: O1

void jpeg_mem_src(j_decompress_ptr cinfo,uchar *inbuffer,unsigned_long insize)

{
  jpeg_error_mgr *pjVar1;
  jpeg_source_mgr *pjVar2;
  
  if (inbuffer == (uchar *)0x0 || insize == 0) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x2a;
    (*pjVar1->error_exit)((j_common_ptr)cinfo);
  }
  if (cinfo->src == (jpeg_source_mgr *)0x0) {
    pjVar2 = (jpeg_source_mgr *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,0,0x38);
    cinfo->src = pjVar2;
  }
  else if (cinfo->src->init_source != init_mem_source) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x17;
    (*pjVar1->error_exit)((j_common_ptr)cinfo);
  }
  pjVar2 = cinfo->src;
  pjVar2->init_source = init_mem_source;
  pjVar2->fill_input_buffer = fill_mem_input_buffer;
  pjVar2->skip_input_data = skip_input_data;
  pjVar2->resync_to_restart = jpeg_resync_to_restart;
  pjVar2->term_source = term_source;
  pjVar2->bytes_in_buffer = insize;
  pjVar2->next_input_byte = inbuffer;
  return;
}

Assistant:

GLOBAL(void)
jpeg_mem_src(j_decompress_ptr cinfo, const unsigned char *inbuffer,
             unsigned long insize)
{
  struct jpeg_source_mgr *src;

  if (inbuffer == NULL || insize == 0)  /* Treat empty input as fatal error */
    ERREXIT(cinfo, JERR_INPUT_EMPTY);

  /* The source object is made permanent so that a series of JPEG images
   * can be read from the same buffer by calling jpeg_mem_src only before
   * the first one.
   */
  if (cinfo->src == NULL) {     /* first time for this JPEG object? */
    cinfo->src = (struct jpeg_source_mgr *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_PERMANENT,
                                  sizeof(struct jpeg_source_mgr));
  } else if (cinfo->src->init_source != init_mem_source) {
    /* It is unsafe to reuse the existing source manager unless it was created
     * by this function.
     */
    ERREXIT(cinfo, JERR_BUFFER_SIZE);
  }

  src = cinfo->src;
  src->init_source = init_mem_source;
  src->fill_input_buffer = fill_mem_input_buffer;
  src->skip_input_data = skip_input_data;
  src->resync_to_restart = jpeg_resync_to_restart; /* use default method */
  src->term_source = term_source;
  src->bytes_in_buffer = (size_t)insize;
  src->next_input_byte = (const JOCTET *)inbuffer;
}